

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

void __thiscall kj::MainBuilder::Impl::~Impl(Impl *this)

{
  Impl *this_local;
  
  Maybe<kj::Function<kj::MainBuilder::Validity_()>_>::~Maybe(&this->finalCallback);
  Vector<kj::MainBuilder::Impl::Arg>::~Vector(&this->args);
  std::
  map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
  ::~map(&this->subCommands);
  std::
  map<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::CharArrayCompare,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
  ::~map(&this->longOptions);
  std::
  map<char,_kj::MainBuilder::Impl::Option_*,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
  ::~map(&this->shortOptions);
  Arena::~Arena(&this->arena);
  return;
}

Assistant:

inline Impl(ProcessContext& context, StringPtr version,
              StringPtr briefDescription, StringPtr extendedDescription)
      : context(context), version(version),
        briefDescription(briefDescription), extendedDescription(extendedDescription) {}